

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O2

void __thiscall OpenMD::Perturbations::Light::initialize(Light *this)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  _Rb_tree_header *p_Var1;
  double dVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  iterator iVar5;
  pointer pcVar6;
  byte bVar7;
  bool bVar8;
  long lVar9;
  LightParameters *pLVar10;
  byte bVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  stringToPolarization;
  
  pLVar10 = this->lightParams;
  bVar12 = (pLVar10->WaveVector).super_ParameterBase.empty_ == false;
  if (bVar12) {
    std::vector<double,_std::allocator<double>_>::vector(&k,&(pLVar10->WaveVector).data_);
    (this->k_).super_Vector<double,_3U>.data_[0] =
         *k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (this->k_).super_Vector<double,_3U>.data_[1] =
         k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[1];
    (this->k_).super_Vector<double,_3U>.data_[2] =
         k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[2];
    dVar15 = Vector<double,_3U>::length(&(this->k_).super_Vector<double,_3U>);
    this->kmag_ = dVar15;
    this->lambda_ = 6.283185307179586 / dVar15;
    this->omega_ = 18836.515673088536 / (6.283185307179586 / dVar15);
    Vector<double,_3U>::operator=
              (&(this->khat_).super_Vector<double,_3U>,&(this->k_).super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&(this->khat_).super_Vector<double,_3U>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&k.super__Vector_base<double,_std::allocator<double>_>);
    pLVar10 = this->lightParams;
  }
  bVar8 = bVar12;
  if ((pLVar10->PropagationDirection).super_ParameterBase.empty_ == false) {
    if (bVar12) {
      memcpy(&painCave,
             "light: please specify either waveVector or propagationDirection, but not both.\n",0x50
            );
      painCave.isFatal = 1;
      simError();
      pLVar10 = this->lightParams;
    }
    std::vector<double,_std::allocator<double>_>::vector(&k,&(pLVar10->PropagationDirection).data_);
    (this->khat_).super_Vector<double,_3U>.data_[0] =
         *k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (this->khat_).super_Vector<double,_3U>.data_[1] =
         k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[1];
    (this->khat_).super_Vector<double,_3U>.data_[2] =
         k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[2];
    Vector<double,_3U>::normalize(&(this->khat_).super_Vector<double,_3U>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&k.super__Vector_base<double,_std::allocator<double>_>);
    pLVar10 = this->lightParams;
    bVar8 = true;
  }
  if ((pLVar10->Wavelength).super_ParameterBase.empty_ == false) {
    if (bVar12) {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
      pLVar10 = this->lightParams;
    }
    dVar15 = (pLVar10->Wavelength).data_ * 10.0;
    this->lambda_ = dVar15;
    this->omega_ = 18836.515673088536 / dVar15;
    this->kmag_ = 6.283185307179586 / dVar15;
    bVar12 = true;
  }
  if ((pLVar10->Frequency).super_ParameterBase.empty_ == false) {
    if (bVar12) {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
      pLVar10 = this->lightParams;
    }
    dVar15 = (pLVar10->Frequency).data_ * 1e-15;
    this->omega_ = dVar15;
    dVar15 = 18836.515673088536 / dVar15;
    this->lambda_ = dVar15;
    this->kmag_ = 6.283185307179586 / dVar15;
LAB_0016cb23:
    bVar11 = 1;
    if (bVar8 != false) {
      operator*((Vector<double,_3U> *)&k,&(this->khat_).super_Vector<double,_3U>,this->kmag_);
      Vector3<double>::operator=(&this->k_,(Vector<double,_3U> *)&k);
      pLVar10 = this->lightParams;
    }
  }
  else {
    if (bVar12) goto LAB_0016cb23;
    bVar11 = 0;
  }
  bVar12 = (pLVar10->Intensity).super_ParameterBase.empty_;
  if (bVar12 == false) {
    dVar15 = (pLVar10->Intensity).data_ * 1.439326e-11;
    dVar15 = (dVar15 + dVar15) / 0.7184379357665581;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    this->E0_ = dVar15;
  }
  this_00 = &this->jones_;
  pcVar6 = (this->jones_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->jones_).
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar6) {
    (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar6;
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve(this_00,2);
  p_Var1 = &stringToPolarization._M_t._M_impl.super__Rb_tree_header;
  stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string<std::allocator<char>>((string *)&k,"X",(allocator<char> *)&local_80);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[](&stringToPolarization,(key_type *)&k);
  *pmVar3 = lightX;
  std::__cxx11::string::~string((string *)&k);
  std::__cxx11::string::string<std::allocator<char>>((string *)&k,"Y",(allocator<char> *)&local_80);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[](&stringToPolarization,(key_type *)&k);
  *pmVar3 = lightY;
  std::__cxx11::string::~string((string *)&k);
  std::__cxx11::string::string<std::allocator<char>>((string *)&k,"+",(allocator<char> *)&local_80);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[](&stringToPolarization,(key_type *)&k);
  *pmVar3 = lightPlus;
  std::__cxx11::string::~string((string *)&k);
  std::__cxx11::string::string<std::allocator<char>>((string *)&k,"-",(allocator<char> *)&local_80);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[](&stringToPolarization,(key_type *)&k);
  *pmVar3 = lightMinus;
  std::__cxx11::string::~string((string *)&k);
  if ((this->lightParams->Polarization).super_ParameterBase.empty_ != false) {
    k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&k.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    lVar9 = 0;
    for (p_Var4 = stringToPolarization._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 1),", ");
      std::__cxx11::string::append((string *)&k);
      std::__cxx11::string::~string((string *)&local_80);
      lVar9 = (long)&(p_Var4[1]._M_parent)->_M_color + (long)(int)lVar9 + 2;
      if (0x31 < (int)lVar9) {
        std::__cxx11::string::append((char *)&k);
        lVar9 = 0;
      }
    }
    std::__cxx11::string::erase
              ((ulong)&k,
               (long)k.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - 2);
    snprintf(painCave.errMsg,2000,
             "Light: No polarization was set in the omd file. This parameter\n\tmust be set to use Light, and can take any of these values:\n\t\t%s.\n"
             ,k.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    std::__cxx11::string::~string((string *)&k);
    bVar7 = 0;
    goto LAB_0016cea0;
  }
  std::__cxx11::string::string((string *)&k,(string *)&(this->lightParams->Polarization).data_);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
          ::find(&stringToPolarization._M_t,(key_type *)&k);
  switch(iVar5._M_node[2]._M_color) {
  case _S_red:
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar6->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar6->_M_value + 8) = 0;
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar6[1]._M_value = 0;
    *(undefined8 *)(pcVar6[1]._M_value + 8) = 0;
    goto LAB_0016ce94;
  case _S_black:
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar6->_M_value = 0;
    *(undefined8 *)(pcVar6->_M_value + 8) = 0;
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0x3ff00000;
    uVar14 = 0;
    break;
  case 2:
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar6->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar6->_M_value + 8) = 0;
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar14 = 0x3ff00000;
    break;
  case 3:
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar6->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar6->_M_value + 8) = 0;
    pcVar6 = (this_00->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar14 = 0xbff00000;
    break;
  default:
    builtin_strncpy(painCave.errMsg + 0x10,"olarization type\n",0x12);
    builtin_strncpy(painCave.errMsg,"Light: Unknown p",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    bVar7 = 0;
    goto LAB_0016ce96;
  }
  *(undefined4 *)pcVar6[1]._M_value = 0;
  *(undefined4 *)(pcVar6[1]._M_value + 4) = uVar13;
  *(undefined4 *)(pcVar6[1]._M_value + 8) = 0;
  *(undefined4 *)(pcVar6[1]._M_value + 0xc) = uVar14;
LAB_0016ce94:
  bVar7 = 1;
LAB_0016ce96:
  std::__cxx11::string::~string((string *)&k);
LAB_0016cea0:
  if ((byte)(bVar11 & bVar8 & bVar7 & (bVar12 ^ 1U)) == 1) {
    this->doLight = true;
  }
  else {
    if (bVar8 == false) {
      builtin_strncpy(painCave.errMsg,"Light: could not determine direction of propagation.\n",0x36)
      ;
      painCave.isFatal = 1;
      simError();
    }
    if (bVar12 != false) {
      builtin_strncpy(painCave.errMsg + 0x10," not specified.\n",0x11);
      builtin_strncpy(painCave.errMsg,"Light: intensity",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar11 == 0) {
      builtin_strncpy(painCave.errMsg,"Light: could not determine frequency or wavelength.\n",0x35);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar7 == 0) {
      builtin_strncpy(painCave.errMsg,"Light: polarization  not specifieid.\n",0x26);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((this->info_->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  dVar15 = (this->khat_).super_Vector<double,_3U>.data_[2];
  uVar13 = SUB84(dVar15,0);
  uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
  if (dVar15 <= -1.0) {
    uVar13 = 0;
    uVar14 = 0xbff00000;
  }
  if (1.0 <= (double)CONCAT44(uVar14,uVar13)) {
    uVar13 = 0;
    uVar14 = 0x3ff00000;
  }
  dVar15 = acos((double)CONCAT44(uVar14,uVar13));
  dVar2 = atan2(-(this->khat_).super_Vector<double,_3U>.data_[1],
                (this->khat_).super_Vector<double,_3U>.data_[0]);
  SquareMatrix3<double>::setupRotMat
            (&this->A_,
             (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar2 |
                     (ulong)(dVar2 + 6.283185307179586) & -(ulong)(dVar2 < 0.0)),dVar15,0.0);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)&k,&this->A_);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->Ainv_,(RectMatrix<double,_3U,_3U> *)&k);
  this->initialized = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  ::~_Rb_tree(&stringToPolarization._M_t);
  return;
}

Assistant:

void Light::initialize() {
    bool haveE0           = false;
    bool haveDirection    = false;
    bool haveFrequency    = false;
    bool havePolarization = false;

    if (lightParams->haveWaveVector()) {
      std::vector<RealType> k = lightParams->getWaveVector();
      // wave vectors are input in inverse angstroms, so no unit conversion:
      k_.x()        = k[0];
      k_.y()        = k[1];
      k_.z()        = k[2];
      kmag_         = k_.length();
      lambda_       = 2.0 * Constants::PI / kmag_;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      haveFrequency = true;
      khat_         = k_;
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->havePropagationDirection()) {
      if (haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify either waveVector or "
                 "propagationDirection, but not both.\n");
        painCave.isFatal = 1;
        simError();
      }
      std::vector<RealType> pd = lightParams->getPropagationDirection();
      khat_.x()                = pd[0];
      khat_.y()                = pd[1];
      khat_.z()                = pd[2];
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->haveWavelength()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // wavelengths are entered in nm to work with experimentalists.
      // Convert to angstroms:
      lambda_       = lightParams->getWavelength() * 10.0;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (lightParams->haveFrequency()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // frequencies are entered in Hz to work with experimentalists.
      // Convert to fs^-1
      omega_        = lightParams->getFrequency() * 1.0e-15;
      lambda_       = 2.0 * Constants::PI * Constants::c / omega_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (haveFrequency && haveDirection) { k_ = khat_ * kmag_; }

    if (lightParams->haveIntensity()) {
      RealType intense = lightParams->getIntensity();
      // intensities are input in W/cm^2
      intense *= 1.439326e-11;
      E0_ = std::sqrt(2.0 * intense / (Constants::epsilon0 * Constants::c));
      // E0 now has units of kcal/mol e^-1 Angstroms^-1
      haveE0 = true;
    }

    // Determine Polarization Type
    jones_.clear();
    jones_.reserve(2);
    std::map<std::string, LightPolarization> stringToPolarization;

    stringToPolarization["X"] = lightX;
    stringToPolarization["Y"] = lightY;
    stringToPolarization["+"] = lightPlus;
    stringToPolarization["-"] = lightMinus;

    if (lightParams->havePolarization()) {
      std::string lpl      = lightParams->getPolarization();
      LightPolarization lp = stringToPolarization.find(lpl)->second;
      switch (lp) {
      case lightX:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 0.0};
        havePolarization = true;
        break;
      case lightY:
        jones_[0]        = {0.0, 0.0};
        jones_[1]        = {1.0, 0.0};
        havePolarization = true;
        break;
      case lightPlus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 1.0};
        havePolarization = true;
        break;
      case lightMinus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, -1.0};
        havePolarization = true;
        break;
      default:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: Unknown polarization type\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
        break;
      }

    } else {
      std::string allowedPolarizations;
      int currentLineLength = 0;

      for (std::map<std::string, LightPolarization>::iterator polStrIter =
               stringToPolarization.begin();
           polStrIter != stringToPolarization.end(); ++polStrIter) {
        allowedPolarizations += polStrIter->first + ", ";
        currentLineLength += polStrIter->first.length() + 2;

        if (currentLineLength >= 50) {
          allowedPolarizations += "\n\t\t";
          currentLineLength = 0;
        }
      }

      allowedPolarizations.erase(allowedPolarizations.length() - 2, 2);

      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Light: No polarization was set in the omd file. This parameter\n"
          "\tmust be set to use Light, and can take any of these values:\n"
          "\t\t%s.\n",
          allowedPolarizations.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (haveE0 && haveDirection && haveFrequency && havePolarization) {
      doLight = true;
    } else {
      if (!haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine direction of propagation.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveE0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: intensity not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine frequency or wavelength.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!havePolarization) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: polarization  not specifieid.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;

    // Relatively simple Euler angles between khat_ and lab frame:

    RealType psi = 0.0;
    RealType theta =
        acos(std::min((RealType)1.0, std::max((RealType)-1.0, khat_[2])));
    RealType phi = std::atan2(-khat_[1], khat_[0]);

    if (phi < 0) phi += 2.0 * Constants::PI;

    A_.setupRotMat(phi, theta, psi);
    Ainv_ = A_.inverse();

    initialized = true;
  }